

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O0

int tinyusdz::USDZResolveAsset
              (char *asset_name,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *search_paths,string *resolved_asset_name,string *err,void *userdata)

{
  bool bVar1;
  size_type sVar2;
  USDZAsset *passet;
  string local_c8;
  string local_a8;
  allocator local_81;
  string local_80;
  allocator local_59;
  undefined1 local_58 [8];
  string asset_path;
  void *userdata_local;
  string *err_local;
  string *resolved_asset_name_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *search_paths_local;
  char *asset_name_local;
  
  if (userdata == (void *)0x0) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::operator+=((string *)err,"`userdata` must be non-null.\n");
    }
    asset_name_local._4_4_ = -2;
  }
  else if (asset_name == (char *)0x0) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::operator+=((string *)err,"`asset_name` must be non-null.\n");
    }
    asset_name_local._4_4_ = -2;
  }
  else if (resolved_asset_name == (string *)0x0) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::operator+=((string *)err,"`resolved_asset_name` must be non-null.\n");
    }
    asset_name_local._4_4_ = -2;
  }
  else {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)local_58,asset_name,&local_59);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_59);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_80,"./",&local_81);
    bVar1 = startsWith((string *)local_58,&local_80);
    ::std::__cxx11::string::~string((string *)&local_80);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_81);
    if (bVar1) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_c8,"./",(allocator *)((long)&passet + 7));
      removePrefix(&local_a8,(string *)local_58,&local_c8);
      ::std::__cxx11::string::operator=((string *)local_58,(string *)&local_a8);
      ::std::__cxx11::string::~string((string *)&local_a8);
      ::std::__cxx11::string::~string((string *)&local_c8);
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&passet + 7));
    }
    sVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                     *)userdata,(key_type *)local_58);
    if (sVar2 == 0) {
      asset_name_local._4_4_ = -1;
    }
    else {
      ::std::__cxx11::string::operator=((string *)resolved_asset_name,(string *)local_58);
      asset_name_local._4_4_ = 0;
    }
    ::std::__cxx11::string::~string((string *)local_58);
  }
  return asset_name_local._4_4_;
}

Assistant:

int USDZResolveAsset(const char *asset_name, const std::vector<std::string> &search_paths, std::string *resolved_asset_name, std::string *err, void *userdata) {

  DCOUT("Resolve asset: " << asset_name);

  if (!userdata) {
    if (err) {
      (*err) += "`userdata` must be non-null.\n";
    }
    return -2;
  }

  if (!asset_name) {
    if (err) {
      (*err) += "`asset_name` must be non-null.\n";
    }
    return -2;
  }

  if (!resolved_asset_name) {
    if (err) {
      (*err) += "`resolved_asset_name` must be non-null.\n";
    }
    return -2;
  }

  std::string asset_path = asset_name;

  // Remove relative path prefix './'
  if (tinyusdz::startsWith(asset_path, "./")) {
    asset_path = tinyusdz::removePrefix(asset_path, "./");
  }

  // Not used
  (void)search_paths;

  const USDZAsset *passet = reinterpret_cast<const USDZAsset *>(userdata);

  if (passet->asset_map.count(asset_path)) {
    DCOUT("Resolved asset: " << asset_name << " as " << asset_path);
    (*resolved_asset_name) = asset_path;
    return 0;
  }

  return -1; // not found
}